

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

void __thiscall
pugi::impl::anon_unknown_0::xml_buffered_writer::flush
          (xml_buffered_writer *this,char_t *data,size_t size)

{
  anon_union_8192_4_fbc60714_for_scratch *paVar1;
  ulong uVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  xml_encoding xVar6;
  _func_int *UNRECOVERED_JUMPTABLE;
  value_type i;
  anon_union_8192_4_fbc60714_for_scratch *paVar7;
  uint *puVar8;
  anon_union_8192_4_fbc60714_for_scratch *paVar9;
  long lVar10;
  ushort uVar11;
  uint uVar12;
  uint uVar13;
  long lVar14;
  uint uVar15;
  byte bVar16;
  
  if (size == 0) {
    return;
  }
  xVar6 = this->encoding;
  if (xVar6 == encoding_utf8) {
    UNRECOVERED_JUMPTABLE = this->writer->_vptr_xml_writer[2];
    (*UNRECOVERED_JUMPTABLE)(this->writer,data,size,data,UNRECOVERED_JUMPTABLE);
    return;
  }
  paVar1 = &this->scratch;
  paVar9 = paVar1;
  if ((xVar6 & ~encoding_utf8) != encoding_utf16_le) {
    if (1 < xVar6 - encoding_utf32_le) {
      if (xVar6 != encoding_latin1) {
        __assert_fail("false && \"Invalid encoding\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/external/pugixml/pugixml.cpp"
                      ,0xe78,
                      "size_t pugi::impl::(anonymous namespace)::convert_buffer_output(char_t *, uint8_t *, uint16_t *, uint32_t *, const char_t *, size_t, xml_encoding)"
                     );
      }
LAB_00218f45:
      do {
        puVar8 = (uint *)data;
        lVar14 = 0;
        lVar10 = 3;
        while( true ) {
          if (size + lVar14 == 0) goto LAB_0021911f;
          bVar3 = *(byte *)((long)puVar8 + lVar10 + -3);
          if (-1 < (char)bVar3) {
            paVar9->data_u8[0] = bVar3;
            paVar9 = (anon_union_8192_4_fbc60714_for_scratch *)(paVar9->data_u8 + 1);
            data = (char_t *)((long)puVar8 + (1 - lVar14));
            size = (size + lVar14) - 1;
            if ((size < 4) || ((((int)puVar8 - (int)lVar14) + 1U & 3) != 0)) goto LAB_00218f45;
            goto LAB_00219050;
          }
          if ((((2 < size + lVar14) && ((bVar3 & 0xf0) == 0xe0)) &&
              (bVar16 = *(byte *)((long)puVar8 + lVar10 + -2), (bVar16 & 0xc0) == 0x80)) &&
             (bVar4 = *(byte *)((long)puVar8 + lVar10 + -1), (bVar4 & 0xc0) == 0x80)) break;
          lVar14 = lVar14 + -1;
          lVar10 = lVar10 + 1;
        }
        uVar13 = (uint)bVar16 << 6;
        bVar16 = bVar4 & 0x3f | (byte)uVar13;
        if ((uVar13 & 0xf00) != 0 || (bVar3 & 0xf) != 0) {
          bVar16 = 0x3f;
        }
        paVar9->data_u8[0] = bVar16;
        paVar9 = (anon_union_8192_4_fbc60714_for_scratch *)((long)paVar9 + 1);
        size = (size + lVar14) - 3;
        data = (char_t *)((long)puVar8 + (3 - lVar14));
      } while( true );
    }
LAB_00218d08:
    do {
      puVar8 = (uint *)data;
      lVar14 = 0;
      lVar10 = 3;
      while( true ) {
        uVar2 = size + lVar14;
        if (uVar2 == 0) {
          paVar7 = paVar1;
          if (xVar6 != encoding_utf32_le) {
            for (; paVar7 != paVar9;
                paVar7 = (anon_union_8192_4_fbc60714_for_scratch *)((long)paVar7 + 4)) {
              uVar13 = paVar7->data_u32[0];
              paVar7->data_u32[0] =
                   uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 |
                   uVar13 << 0x18;
            }
          }
          goto LAB_0021911f;
        }
        bVar3 = *(byte *)((long)puVar8 + lVar10 + -3);
        uVar13 = (uint)bVar3;
        if (-1 < (char)bVar3) {
          paVar9->data_u32[0] = uVar13;
          paVar9 = (anon_union_8192_4_fbc60714_for_scratch *)(paVar9->data_u32 + 1);
          data = (char_t *)((long)puVar8 + (1 - lVar14));
          size = (size + lVar14) - 1;
          if ((size < 4) || ((((int)puVar8 - (int)lVar14) + 1U & 3) != 0)) goto LAB_00218d08;
          goto LAB_00218e31;
        }
        if (((uVar2 != 1) && ((uVar13 & 0xffffffe0) == 0xc0)) &&
           (uVar12 = (uint)*(byte *)((long)puVar8 + lVar10 + -2), (uVar12 & 0xffffffc0) == 0x80)) {
          paVar9->data_u32[0] = uVar12 & 0x3f | (uVar13 & 0x1f) << 6;
          paVar9 = (anon_union_8192_4_fbc60714_for_scratch *)((long)paVar9 + 4);
          size = (size + lVar14) - 2;
          data = (char_t *)((long)puVar8 + (2 - lVar14));
          goto LAB_00218d08;
        }
        if ((((2 < uVar2) && ((uVar13 & 0xfffffff0) == 0xe0)) &&
            (uVar12 = (uint)*(byte *)((long)puVar8 + lVar10 + -2), (uVar12 & 0xffffffc0) == 0x80))
           && (bVar16 = *(byte *)((long)puVar8 + lVar10 + -1), (bVar16 & 0xc0) == 0x80)) {
          paVar9->data_u32[0] = bVar16 & 0x3f | (uVar12 & 0x3f) << 6 | (bVar3 & 0xf) << 0xc;
          paVar9 = (anon_union_8192_4_fbc60714_for_scratch *)((long)paVar9 + 4);
          size = (size + lVar14) - 3;
          data = (char_t *)((long)puVar8 + (3 - lVar14));
          goto LAB_00218d08;
        }
        if (((3 < uVar2) && ((bVar3 & 0xf8) == 0xf0)) &&
           ((uVar12 = (uint)*(byte *)((long)puVar8 + lVar10 + -2), (uVar12 & 0xffffffc0) == 0x80 &&
            ((uVar15 = (uint)*(byte *)((long)puVar8 + lVar10 + -1), (uVar15 & 0xffffffc0) == 0x80 &&
             ((*(byte *)((long)puVar8 + lVar10) & 0xc0) == 0x80)))))) break;
        lVar14 = lVar14 + -1;
        lVar10 = lVar10 + 1;
      }
      paVar9->data_u32[0] =
           *(byte *)((long)puVar8 + lVar10) & 0x3f |
           (uVar15 & 0x3f) << 6 | (uVar12 & 0x3f) << 0xc | (uVar13 & 7) << 0x12;
      paVar9 = (anon_union_8192_4_fbc60714_for_scratch *)((long)paVar9 + 4);
      size = (size + lVar14) - 4;
      data = (char_t *)((long)puVar8 + (4 - lVar14));
    } while( true );
  }
LAB_00218ac7:
  puVar8 = (uint *)data;
  lVar14 = 0;
  lVar10 = 3;
  do {
    uVar2 = size + lVar14;
    if (uVar2 == 0) {
      paVar7 = paVar1;
      if (xVar6 != encoding_utf16_le) {
        for (; paVar7 != paVar9;
            paVar7 = (anon_union_8192_4_fbc60714_for_scratch *)((long)paVar7 + 2)) {
          paVar7->data_u16[0] = paVar7->data_u16[0] << 8 | paVar7->data_u16[0] >> 8;
        }
      }
LAB_0021911f:
      if ((ulong)((long)paVar9 - (long)paVar1->data_u8) < 0x2001) {
        (*this->writer->_vptr_xml_writer[2])();
        return;
      }
      __assert_fail("result <= sizeof(scratch)",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/external/pugixml/pugixml.cpp"
                    ,0xe9a,
                    "void pugi::impl::(anonymous namespace)::xml_buffered_writer::flush(const char_t *, size_t)"
                   );
    }
    bVar3 = *(byte *)((long)puVar8 + lVar10 + -3);
    if (-1 < (char)bVar3) {
      *(ushort *)paVar9 = (ushort)bVar3;
      paVar9 = (anon_union_8192_4_fbc60714_for_scratch *)(paVar9->data_u16 + 1);
      data = (char_t *)((long)puVar8 + (1 - lVar14));
      size = (size + lVar14) - 1;
      if ((size < 4) || ((((int)puVar8 - (int)lVar14) + 1U & 3) != 0)) goto LAB_00218ac7;
      goto LAB_00218bed;
    }
    if (((uVar2 != 1) && ((bVar3 & 0xe0) == 0xc0)) &&
       (bVar16 = *(byte *)((long)puVar8 + lVar10 + -2), (bVar16 & 0xc0) == 0x80)) {
      paVar9->data_u16[0] = bVar16 & 0x3f | (ushort)((bVar3 & 0x1f) << 6);
      paVar9 = (anon_union_8192_4_fbc60714_for_scratch *)((long)paVar9 + 2);
      size = (size + lVar14) - 2;
      data = (char_t *)((long)puVar8 + (2 - lVar14));
      goto LAB_00218ac7;
    }
    if (((2 < uVar2) && ((bVar3 & 0xf0) == 0xe0)) &&
       ((uVar11 = (ushort)*(byte *)((long)puVar8 + lVar10 + -2), (uVar11 & 0xffc0) == 0x80 &&
        (bVar16 = *(byte *)((long)puVar8 + lVar10 + -1), (bVar16 & 0xc0) == 0x80)))) {
      paVar9->data_u16[0] = bVar16 & 0x3f | (uVar11 & 0x3f) << 6 | (ushort)bVar3 << 0xc;
      paVar9 = (anon_union_8192_4_fbc60714_for_scratch *)((long)paVar9 + 2);
      size = (size + lVar14) - 3;
      data = (char_t *)((long)puVar8 + (3 - lVar14));
      goto LAB_00218ac7;
    }
    if (((3 < uVar2) && ((bVar3 & 0xf8) == 0xf0)) &&
       ((bVar16 = *(byte *)((long)puVar8 + lVar10 + -2), (bVar16 & 0xc0) == 0x80 &&
        ((bVar4 = *(byte *)((long)puVar8 + lVar10 + -1), (bVar4 & 0xc0) == 0x80 &&
         (bVar5 = *(byte *)((long)puVar8 + lVar10), (bVar5 & 0xc0) == 0x80)))))) goto LAB_00218c92;
    lVar14 = lVar14 + -1;
    lVar10 = lVar10 + 1;
  } while( true );
  while( true ) {
    paVar9->data_u8[0] = (byte)*(uint *)data;
    paVar9->data_u8[1] = *(byte *)((long)data + 1);
    paVar9->data_u8[2] = *(byte *)((long)data + 2);
    paVar9->data_u8[3] = *(byte *)((long)data + 3);
    paVar9 = (anon_union_8192_4_fbc60714_for_scratch *)(paVar9->data_u8 + 4);
    data = (char_t *)((long)data + 4);
    size = size - 4;
    if (size < 4) break;
LAB_00219050:
    if ((*(uint *)data & 0x80808080) != 0) break;
  }
  goto LAB_00218f45;
  while( true ) {
    paVar9->data_u32[0] = *(uint *)data & 0x7f;
    *(uint *)((long)paVar9 + 4) = (uint)*(byte *)((long)data + 1);
    *(uint *)((long)paVar9 + 8) = (uint)*(byte *)((long)data + 2);
    *(uint *)((long)paVar9 + 0xc) = (uint)*(byte *)((long)data + 3);
    paVar9 = (anon_union_8192_4_fbc60714_for_scratch *)(paVar9->data_u32 + 4);
    data = (char_t *)((long)data + 4);
    size = size - 4;
    if (size < 4) break;
LAB_00218e31:
    if ((*(uint *)data & 0x80808080) != 0) break;
  }
  goto LAB_00218d08;
  while( true ) {
    paVar9->data_u16[0] = (ushort)*(uint *)data & 0x7f;
    *(ushort *)((long)paVar9 + 2) = (ushort)*(byte *)((long)data + 1);
    *(ushort *)((long)paVar9 + 4) = (ushort)*(byte *)((long)data + 2);
    *(ushort *)((long)paVar9 + 6) = (ushort)*(byte *)((long)data + 3);
    paVar9 = (anon_union_8192_4_fbc60714_for_scratch *)(paVar9->data_u16 + 4);
    data = (char_t *)((long)data + 4);
    size = size - 4;
    if (size < 4) break;
LAB_00218bed:
    if ((*(uint *)data & 0x80808080) != 0) break;
  }
  goto LAB_00218ac7;
LAB_00218c92:
  uVar13 = (uint)bVar4 << 6;
  paVar9->data_u16[0] =
       (short)((uVar13 & 0xc00) + ((bVar16 & 0x3f) << 0xc | (bVar3 & 7) << 0x12) + 0x3ff0000 >> 10)
       + 0xd800;
  paVar9->data_u16[1] = bVar5 & 0x3f | (ushort)uVar13 & 0x3ff | 0xdc00;
  paVar9 = (anon_union_8192_4_fbc60714_for_scratch *)((long)paVar9 + 4);
  size = (size + lVar14) - 4;
  data = (char_t *)((long)puVar8 + (4 - lVar14));
  goto LAB_00218ac7;
}

Assistant:

void flush(const char_t* data, size_t size)
		{
			if (size == 0) return;

			// fast path, just write data
			if (encoding == get_write_native_encoding())
				writer.write(data, size * sizeof(char_t));
			else
			{
				// convert chunk
				size_t result = convert_buffer_output(scratch.data_char, scratch.data_u8, scratch.data_u16, scratch.data_u32, data, size, encoding);
				assert(result <= sizeof(scratch));

				// write data
				writer.write(scratch.data_u8, result);
			}
		}